

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

int __thiscall libtorrent::aux::torrent::init(torrent *this,EVP_PKEY_CTX *ctx)

{
  piece_index_t index;
  session_interface *psVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int extraout_EAX;
  torrent_info *this_00;
  undefined8 uVar5;
  size_type sVar6;
  element_type *peVar7;
  file_storage *pfVar8;
  reference ppVar9;
  vector<peer_connection_*> *this_01;
  reference pppVar10;
  element_type *peVar11;
  reference psVar12;
  reference psVar13;
  pointer ppVar14;
  element_type *peVar15;
  vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
  *this_02;
  element_type *this_03;
  value_type *this_04;
  pointer paVar16;
  undefined4 extraout_var;
  peer_connection *ctx_00;
  char *in_R9;
  undefined1 auVar17 [16];
  string_view lhs;
  string_view rhs;
  pointer local_628;
  byte local_609;
  byte local_5ba;
  bool local_569;
  storage_error local_548;
  status_t local_529;
  enable_shared_from_this<libtorrent::aux::torrent> local_528;
  function<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_libtorrent::storage_error_&)>
  local_518;
  container_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4f8;
  uint local_4dc;
  undefined8 local_4d8;
  unsigned_long local_4d0;
  unsigned_long local_4c8;
  int local_4c0;
  allocator<char> local_4b9;
  string local_4b8;
  file_index_t local_494;
  string local_490;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  string local_450;
  reference local_430;
  link_t *i_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
  *__range4_1;
  vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
  *l;
  undefined1 local_3e8 [24];
  shared_ptr<libtorrent::aux::torrent> *t_1;
  iterator __end4;
  iterator __begin4;
  vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
  *__range4;
  vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
  ts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c_1;
  iterator __end3_5;
  iterator __begin3_5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_5;
  undefined1 local_348 [96];
  weak_ptr<libtorrent::aux::torrent> local_2e8;
  undefined1 local_2d8 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  digest32<160L> *ih;
  iterator __end3_4;
  iterator __begin3_4;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *__range3_4;
  undefined1 local_280 [8];
  resolve_links res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> local_1c8;
  undefined1 local_1b0 [8];
  vector<std::string,_file_index_t> links;
  iterator iStack_188;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> i;
  iterator __end3_3;
  iterator __begin3_3;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *__range3_3;
  undefined8 local_168;
  object_fns *local_160;
  undefined1 local_158 [8];
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  have_pieces;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> local_131;
  iterator iStack_130;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> prio;
  iterator __end3_2;
  iterator __begin3_2;
  vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  *__range3_2;
  piece_index_t idx;
  resume_data_flags_t ns;
  undefined1 local_100 [8];
  shared_ptr<libtorrent::aux::peer_connection> pc;
  peer_connection *c;
  iterator __end3_1;
  iterator __begin3_1;
  vector<peer_connection_*> *__range3_1;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_c8;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_c4;
  reference local_c0;
  pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *f;
  iterator __end3;
  iterator __begin3;
  noexcept_movable<std::map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range3;
  file_storage *fs;
  error_code local_90;
  int local_7c;
  bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> local_75;
  int blocks_per_piece;
  error_code local_70;
  bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> local_5d [5];
  error_code local_58 [2];
  undefined1 local_38 [8];
  string_view cert;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_18;
  torrent *this_local;
  
  local_18._8_8_ = this;
  this_00 = torrent_file(this);
  torrent_info::name_abi_cxx11_(this_00);
  uVar5 = ::std::__cxx11::string::c_str();
  (*(this->super_request_callback)._vptr_request_callback[7])(this,"init torrent: %s",uVar5);
  sVar6 = ::std::
          vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ::size(&(this->m_file_priority).
                  super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                );
  peVar7 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_torrent_hot_members).m_torrent_file);
  iVar3 = torrent_info::num_files(peVar7);
  if (iVar3 < (int)sVar6) {
    peVar7 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_torrent_hot_members).m_torrent_file);
    iVar3 = torrent_info::num_files(peVar7);
    container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
    ::resize<int,void>((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
                        *)&this->m_file_priority,iVar3);
  }
  else {
    paVar16 = ::std::
              unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
              ::operator->(&this->m_add_torrent_params);
    cert._M_str = (char *)0x800000;
    local_18._M_allocated_capacity =
         (size_type)
         libtorrent::flags::operator&
                   ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                    (paVar16->flags).m_val,
                    (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x800000);
    bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                      ((bitfield_flag *)local_18._M_local_buf);
    if (bVar2) {
      peVar7 = ::std::
               __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_torrent_hot_members).m_torrent_file);
      iVar3 = torrent_info::num_files(peVar7);
      container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
      ::resize<int,void>((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
                          *)&this->m_file_priority,iVar3,
                         (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
                         &dont_download);
    }
  }
  peVar7 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_torrent_hot_members).m_torrent_file);
  _local_38 = (undefined1  [16])torrent_info::ssl_cert(peVar7);
  bVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
  auVar17 = _local_38;
  if (!bVar2) {
    *(uint *)&this->field_0x5dd = *(uint *)&this->field_0x5dd & 0xfdffffff | 0x2000000;
    local_58[1].val_ = local_38._0_4_;
    local_58[1].failed_ = (bool)local_38[4];
    local_58[1]._5_3_ = local_38._5_3_;
    cert._M_len = auVar17._8_8_;
    local_58[1].cat_ = (error_category *)cert._M_len;
    _local_38 = auVar17;
    init_ssl(this,(string_view)auVar17);
  }
  peVar7 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_torrent_hot_members).m_torrent_file);
  iVar3 = torrent_info::num_pieces(peVar7);
  if (iVar3 < 0x7fffffff) {
    peVar7 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_torrent_hot_members).m_torrent_file);
    iVar3 = torrent_info::num_pieces(peVar7);
    if (iVar3 == 0) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_70,torrent_invalid_length,(type *)0x0);
      blocks_per_piece = -1;
      set_error(this,&local_70,(file_index_t)0xffffffff);
      libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
      bitfield_flag(&local_75);
      iVar3 = pause(this);
    }
    else {
      peVar7 = ::std::
               __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_torrent_hot_members).m_torrent_file);
      iVar3 = torrent_info::piece_length(peVar7);
      local_7c = (iVar3 + 0x3fff) / 0x4000;
      if (local_7c < 0x8000) {
        peVar7 = ::std::
                 __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->super_torrent_hot_members).m_torrent_file);
        pfVar8 = torrent_info::files(peVar7);
        bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_add_torrent_params);
        if (bVar2) {
          paVar16 = ::std::
                    unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                    ::operator->(&this->m_add_torrent_params);
          __end3 = ::std::
                   map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::begin(&(paVar16->renamed_files).
                            super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          );
          f = (pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)::std::
                 map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end(&(paVar16->renamed_files).
                        super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      );
          while (bVar2 = ::std::operator!=(&__end3,(_Self *)&f), bVar2) {
            ppVar9 = ::std::
                     _Rb_tree_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator*(&__end3);
            local_c0 = ppVar9;
            strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::strong_typedef(&local_c4,0);
            bVar2 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator<
                              (&ppVar9->first,&local_c4);
            ppVar9 = local_c0;
            local_569 = true;
            if (!bVar2) {
              local_c8.m_val = (int)file_storage::end_file(pfVar8);
              local_569 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator>=
                                    (&ppVar9->first,&local_c8);
            }
            if (local_569 == false) {
              peVar7 = ::std::
                       __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&(this->super_torrent_hot_members).m_torrent_file);
              torrent_info::rename_file
                        (peVar7,(file_index_t)(local_c0->first).m_val,&local_c0->second);
            }
            ::std::
            _Rb_tree_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator++(&__end3);
          }
        }
        construct_storage(this);
        if (((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1d & 1) != 0) &&
           (bVar2 = valid_metadata(this), bVar2)) {
          ::std::
          vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ::clear(&(this->m_file_priority).
                   super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 );
          peVar7 = ::std::
                   __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&(this->super_torrent_hot_members).m_torrent_file);
          iVar3 = torrent_info::num_files(peVar7);
          container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
          ::resize<int,void>((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
                              *)&this->m_file_priority,iVar3,
                             (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>
                              *)&dont_download);
        }
        if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x19 & 1) == 0) {
          *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
               *(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xfffffffffdffffff |
               0x2000000;
          this_01 = &(this->super_torrent_hot_members).m_connections;
          __end3_1 = ::std::
                     vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ::begin(&this_01->
                              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            );
          c = (peer_connection *)
              ::std::
              vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ::end(&this_01->
                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   );
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3_1,
                                    (__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                     *)&c), bVar2) {
            pppVar10 = __gnu_cxx::
                       __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                       ::operator*(&__end3_1);
            ctx_00 = *pppVar10;
            pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ctx_00;
            peer_connection::self((peer_connection *)local_100);
            peVar11 = ::std::
                      __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_100);
            uVar4 = (*(peVar11->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
            if ((uVar4 & 1) == 0) {
              peVar11 = ::std::
                        __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_100);
              peer_connection::on_metadata_impl(peVar11);
              peVar11 = ::std::
                        __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_100);
              uVar4 = (*(peVar11->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
              if ((uVar4 & 1) == 0) {
                peVar11 = ::std::
                          __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_100);
                peer_connection::init(peVar11,(EVP_PKEY_CTX *)ctx_00);
                idx.m_val = 0;
              }
              else {
                idx.m_val = 0xf;
              }
            }
            else {
              idx.m_val = 0xf;
            }
            ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
                      ((shared_ptr<libtorrent::aux::peer_connection> *)local_100);
            __gnu_cxx::
            __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
            ::operator++(&__end3_1);
          }
        }
        bVar2 = ::std::
                vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                ::empty(&(this->m_file_priority).
                         super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                       );
        if (!bVar2) {
          __range3_2._7_1_ = (this->m_need_save_resume_data).m_val;
          update_piece_priorities(this,&this->m_file_priority);
          (this->m_need_save_resume_data).m_val = __range3_2._7_1_;
        }
        bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_add_torrent_params);
        if (bVar2) {
          memset(&__range3_2,0,4);
          paVar16 = ::std::
                    unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                    ::operator->(&this->m_add_torrent_params);
          sVar6 = ::std::
                  vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                  ::size(&paVar16->piece_priorities);
          peVar7 = ::std::
                   __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&(this->super_torrent_hot_members).m_torrent_file);
          iVar3 = torrent_info::num_pieces(peVar7);
          if ((ulong)(long)iVar3 < sVar6) {
            paVar16 = ::std::
                      unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                      ::operator->(&this->m_add_torrent_params);
            peVar7 = ::std::
                     __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&(this->super_torrent_hot_members).m_torrent_file);
            iVar3 = torrent_info::num_pieces(peVar7);
            ::std::
            vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
            ::resize(&paVar16->piece_priorities,(long)iVar3);
          }
          paVar16 = ::std::
                    unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                    ::operator->(&this->m_add_torrent_params);
          __end3_2 = ::std::
                     vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     ::begin(&paVar16->piece_priorities);
          iStack_130 = ::std::
                       vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                       ::end(&paVar16->piece_priorities);
          while (bVar2 = __gnu_cxx::operator!=(&__end3_2,&stack0xfffffffffffffed0), bVar2) {
            psVar12 = __gnu_cxx::
                      __normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                      ::operator*(&__end3_2);
            local_131.m_val = psVar12->m_val;
            bVar2 = has_picker(this);
            if ((bVar2) ||
               (bVar2 = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::
                        operator!=(&local_131,
                                   (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>
                                    *)&default_priority), bVar2)) {
              need_picker(this);
              ppVar14 = ::std::
                        unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                        ::operator->(&(this->super_torrent_hot_members).m_picker);
              have_pieces.
              super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_131.m_val;
              piece_picker::set_piece_priority
                        (ppVar14,__range3_2._0_4_,(download_priority_t)local_131.m_val);
            }
            strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++
                      ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&__range3_2);
            __gnu_cxx::
            __normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
            ::operator++(&__end3_2);
          }
          update_gauge(this);
        }
        if (((byte)this->field_0x5cc >> 2 & 1) == 0) {
          need_picker(this);
          this->m_padding_bytes = 0;
          ::std::
          vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ::vector((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                    *)local_158);
          __range3_3 = (vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                        *)this;
          local_168 = pfVar8;
          local_160 = (object_fns *)local_158;
          apply_pad_files<libtorrent::aux::torrent::init()::__1>
                    (pfVar8,(anon_class_24_3_e1a26694 *)&__range3_3);
          __end3_3 = ::std::
                     vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     ::begin((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                              *)local_158);
          iStack_188 = ::std::
                       vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                       ::end((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                              *)local_158);
          while (bVar2 = __gnu_cxx::operator!=(&__end3_3,&stack0xfffffffffffffe78), bVar2) {
            psVar13 = __gnu_cxx::
                      __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                      ::operator*(&__end3_3);
            index.m_val = psVar13->m_val;
            ppVar14 = ::std::
                      unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                      ::operator->(&(this->super_torrent_hot_members).m_picker);
            bVar2 = piece_picker::have_piece(ppVar14,index);
            if (!bVar2) {
              links.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = index.m_val;
              we_have(this,index,false);
            }
            __gnu_cxx::
            __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
            ::operator++(&__end3_3);
          }
          ::std::
          vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ::~vector((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     *)local_158);
        }
        else {
          *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
               *(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xffffffffbfffffff |
               0x40000000;
          update_gauge(this);
          update_state_list(this);
          update_want_tick(this);
        }
        set_state(this,checking_resume_data);
        container_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::container_wrapper((container_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_1b0);
        peVar7 = ::std::
                 __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->super_torrent_hot_members).m_torrent_file);
        res.m_file_roots._M_h._M_single_bucket._7_1_ = 0;
        torrent_info::similar_torrents(&local_1c8,peVar7);
        bVar2 = ::std::
                vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
                empty(&local_1c8);
        local_5ba = 1;
        if (bVar2) {
          peVar7 = ::std::
                   __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&(this->super_torrent_hot_members).m_torrent_file);
          torrent_info::collections_abi_cxx11_(&local_1e0,peVar7);
          res.m_file_roots._M_h._M_single_bucket._7_1_ = 1;
          bVar2 = ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(&local_1e0);
          local_5ba = bVar2 ^ 0xff;
        }
        if ((res.m_file_roots._M_h._M_single_bucket._7_1_ & 1) != 0) {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1e0);
        }
        ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
        ~vector(&local_1c8);
        if ((local_5ba & 1) != 0) {
          ::std::shared_ptr<libtorrent::torrent_info_const>::
          shared_ptr<libtorrent::torrent_info,void>
                    ((shared_ptr<libtorrent::torrent_info_const> *)&__range3_4,
                     &(this->super_torrent_hot_members).m_torrent_file);
          resolve_links::resolve_links
                    ((resolve_links *)local_280,
                     (shared_ptr<const_libtorrent::torrent_info> *)&__range3_4);
          ::std::shared_ptr<const_libtorrent::torrent_info>::~shared_ptr
                    ((shared_ptr<const_libtorrent::torrent_info> *)&__range3_4);
          peVar7 = ::std::
                   __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&(this->super_torrent_hot_members).m_torrent_file);
          torrent_info::similar_torrents
                    ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      *)&__begin3_4,peVar7);
          __end3_4 = ::std::
                     vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ::begin((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                              *)&__begin3_4);
          ih = (digest32<160L> *)
               ::std::
               vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::end
                         ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                           *)&__begin3_4);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3_4,
                                    (__normal_iterator<libtorrent::digest32<160L>_*,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
                                     *)&ih), bVar2) {
            t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    __gnu_cxx::
                    __normal_iterator<libtorrent::digest32<160L>_*,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
                    ::operator*(&__end3_4);
            psVar1 = (this->super_torrent_hot_members).m_ses;
            local_348._32_4_ =
                 *(undefined4 *)
                  &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi[1]._vptr__Sp_counted_base;
            local_348._16_8_ =
                 (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_vptr__Sp_counted_base;
            local_348._24_8_ =
                 *(undefined8 *)
                  &(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count;
            info_hash_t::info_hash_t
                      ((info_hash_t *)(local_348 + 0x2c),
                       (sha1_hash)
                       *(_Type *)t.
                                 super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
            (*(psVar1->super_session_logger)._vptr_session_logger[0x16])
                      (&local_2e8,psVar1,(info_hash_t *)(local_348 + 0x2c));
            ::std::weak_ptr<libtorrent::aux::torrent>::lock
                      ((weak_ptr<libtorrent::aux::torrent> *)local_2d8);
            ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr(&local_2e8);
            bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2d8);
            if (bVar2) {
              peVar15 = ::std::
                        __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_2d8);
              bVar2 = is_seed(peVar15);
              if (bVar2) {
                ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_2d8);
                get_torrent_file((torrent *)local_348);
                peVar15 = ::std::
                          __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_2d8);
                save_path_abi_cxx11_((string *)&__range3_5,peVar15);
                resolve_links::match
                          ((resolve_links *)local_280,
                           (shared_ptr<const_libtorrent::torrent_info> *)local_348,
                           (string *)&__range3_5);
                ::std::__cxx11::string::~string((string *)&__range3_5);
                ::std::shared_ptr<const_libtorrent::torrent_info>::~shared_ptr
                          ((shared_ptr<const_libtorrent::torrent_info> *)local_348);
                idx.m_val = 0;
              }
              else {
                idx.m_val = 0x17;
              }
            }
            else {
              idx.m_val = 0x17;
            }
            ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                      ((shared_ptr<libtorrent::aux::torrent> *)local_2d8);
            __gnu_cxx::
            __normal_iterator<libtorrent::digest32<160L>_*,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
            ::operator++(&__end3_4);
          }
          idx.m_val = 0x16;
          ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
          ~vector((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                   *)&__begin3_4);
          peVar7 = ::std::
                   __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&(this->super_torrent_hot_members).m_torrent_file);
          torrent_info::collections_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__begin3_5,peVar7);
          __end3_5 = ::std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&__begin3_5);
          c_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__begin3_5);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3_5,
                                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&c_1), bVar2) {
            ts.
            super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)__gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&__end3_5);
            psVar1 = (this->super_torrent_hot_members).m_ses;
            (*(psVar1->super_session_logger)._vptr_session_logger[0x27])
                      (&__range4,psVar1,
                       ts.
                       super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            __end4 = ::std::
                     vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                     ::begin((vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                              *)&__range4);
            t_1 = (shared_ptr<libtorrent::aux::torrent> *)
                  ::std::
                  vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                  ::end((vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                         *)&__range4);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end4,(__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                                               *)&t_1), bVar2) {
              local_3e8._16_8_ =
                   __gnu_cxx::
                   __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                   ::operator*(&__end4);
              peVar15 = ::std::
                        __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_3e8._16_8_);
              bVar2 = is_seed(peVar15);
              if (bVar2) {
                ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_3e8._16_8_);
                get_torrent_file((torrent *)local_3e8);
                peVar15 = ::std::
                          __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_3e8._16_8_);
                save_path_abi_cxx11_((string *)&l,peVar15);
                resolve_links::match
                          ((resolve_links *)local_280,
                           (shared_ptr<const_libtorrent::torrent_info> *)local_3e8,(string *)&l);
                ::std::__cxx11::string::~string((string *)&l);
                ::std::shared_ptr<const_libtorrent::torrent_info>::~shared_ptr
                          ((shared_ptr<const_libtorrent::torrent_info> *)local_3e8);
              }
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
              ::operator++(&__end4);
            }
            ::std::
            vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
            ::~vector((vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                       *)&__range4);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end3_5);
          }
          idx.m_val = 0x18;
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__begin3_5);
          this_02 = &resolve_links::get_links((resolve_links *)local_280)->
                     super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
          ;
          bVar2 = ::std::
                  vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                  ::empty(this_02);
          if (!bVar2) {
            peVar7 = ::std::
                     __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&(this->super_torrent_hot_members).m_torrent_file);
            pfVar8 = torrent_info::files(peVar7);
            iVar3 = file_storage::num_files(pfVar8);
            container_wrapper<std::__cxx11::string,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::resize<int,void>((container_wrapper<std::__cxx11::string,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                *)local_1b0,iVar3);
            __end4_1 = ::std::
                       vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                       ::begin(this_02);
            i_1 = (link_t *)
                  ::std::
                  vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                  ::end(this_02);
            while( true ) {
              bVar2 = __gnu_cxx::operator!=
                                (&__end4_1,
                                 (__normal_iterator<const_libtorrent::aux::resolve_links::link_t_*,_std::vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>_>
                                  *)&i_1);
              if (!bVar2) break;
              local_430 = __gnu_cxx::
                          __normal_iterator<const_libtorrent::aux::resolve_links::link_t_*,_std::vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>_>
                          ::operator*(&__end4_1);
              bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_430);
              if (bVar2) {
                auVar17 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)&local_430->save_path);
                local_460 = auVar17;
                this_03 = ::std::
                          __shared_ptr_access<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_430);
                pfVar8 = torrent_info::files(this_03);
                local_494.m_val = (local_430->file_idx).m_val;
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4b8,"",&local_4b9);
                file_storage::file_path(&local_490,pfVar8,local_494,&local_4b8);
                auVar17 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)&local_490);
                lhs._M_str = auVar17._0_8_;
                lhs._M_len = local_460._8_8_;
                rhs._M_str = in_R9;
                rhs._M_len = auVar17._8_8_;
                local_470 = auVar17;
                combine_path_abi_cxx11_(&local_450,(libtorrent *)local_460._0_8_,lhs,rhs);
                local_4c0 = (local_430->file_idx).m_val;
                this_04 = container_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[]((container_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)local_1b0,
                                       (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                                       local_4c0);
                ::std::__cxx11::string::operator=((string *)this_04,(string *)&local_450);
                ::std::__cxx11::string::~string((string *)&local_450);
                ::std::__cxx11::string::~string((string *)&local_490);
                ::std::__cxx11::string::~string((string *)&local_4b8);
                ::std::allocator<char>::~allocator(&local_4b9);
              }
              __gnu_cxx::
              __normal_iterator<const_libtorrent::aux::resolve_links::link_t_*,_std::vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>_>
              ::operator++(&__end4_1);
            }
          }
          resolve_links::~resolve_links((resolve_links *)local_280);
        }
        bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_add_torrent_params);
        local_609 = 1;
        if (bVar2) {
          paVar16 = ::std::
                    unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                    ::operator->(&this->m_add_torrent_params);
          local_4d0 = (paVar16->flags).m_val;
          local_4d8 = 0x400000;
          local_4c8 = (unsigned_long)
                      libtorrent::flags::operator&
                                ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                                 local_4d0,
                                 (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                                 0x400000);
          bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                            ((bitfield_flag *)&local_4c8);
          local_609 = bVar2 ^ 0xff;
        }
        if ((local_609 & 1) == 0) {
          libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>
          ::bitfield_flag(&local_529);
          storage_error::storage_error(&local_548);
          on_resume_data_checked(this,local_529,&local_548);
        }
        else {
          iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[4])();
          local_4dc = (uint)storage_holder::operator_cast_to_strong_typedef(&this->m_storage);
          bVar2 = ::std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr *)&this->m_add_torrent_params);
          if (bVar2) {
            local_628 = ::std::
                        unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                        ::get(&this->m_add_torrent_params);
          }
          else {
            local_628 = (pointer)0x0;
          }
          container_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::container_wrapper(&local_4f8,
                              (container_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_1b0);
          ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this(&local_528);
          ::std::
          function<void(libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>,libtorrent::storage_error_const&)>
          ::function<libtorrent::aux::torrent::init()::__0,void>
                    ((function<void(libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>,libtorrent::storage_error_const&)>
                      *)&local_518,(anon_class_16_1_89917c4a *)&local_528);
          (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x40))
                    ((long *)CONCAT44(extraout_var,iVar3),local_4dc,local_628,&local_4f8,&local_518)
          ;
          ::std::
          function<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_libtorrent::storage_error_&)>
          ::~function(&local_518);
          init()::$_0::~__0((__0 *)&local_528);
          container_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~container_wrapper(&local_4f8);
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"init, async_check_files");
          (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x1f])();
        }
        update_want_peers(this);
        update_want_tick(this);
        maybe_done_flushing(this);
        this->field_0x606 = this->field_0x606 | 0x10;
        container_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~container_wrapper
                  ((container_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_1b0);
        iVar3 = extraout_EAX;
      }
      else {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  (&local_90,invalid_piece_size,(type *)0x0);
        fs._4_4_ = -1;
        set_error(this,&local_90,(file_index_t)0xffffffff);
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
        bitfield_flag((bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> *)
                      ((long)&fs + 3));
        iVar3 = pause(this);
      }
    }
  }
  else {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (local_58,too_many_pieces_in_torrent,(type *)0x0);
    local_5d[1].m_val = 0xff;
    local_5d[2].m_val = 0xff;
    local_5d[3].m_val = 0xff;
    local_5d[4].m_val = 0xff;
    set_error(this,local_58,(file_index_t)0xffffffff);
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
    bitfield_flag(local_5d);
    iVar3 = pause(this);
  }
  return iVar3;
}

Assistant:

void torrent::init()
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(is_single_thread());

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("init torrent: %s", torrent_file().name().c_str());
#endif

		TORRENT_ASSERT(valid_metadata());
		TORRENT_ASSERT(m_torrent_file->num_files() > 0);
		TORRENT_ASSERT(m_torrent_file->total_size() >= 0);

		if (int(m_file_priority.size()) > m_torrent_file->num_files())
			m_file_priority.resize(m_torrent_file->num_files());
		else if (m_add_torrent_params->flags & torrent_flags::default_dont_download)
			m_file_priority.resize(m_torrent_file->num_files(), dont_download);

		auto cert = m_torrent_file->ssl_cert();
		if (!cert.empty())
		{
			m_ssl_torrent = true;
#ifdef TORRENT_SSL_PEERS
			init_ssl(cert);
#endif
		}

		if (m_torrent_file->num_pieces() > piece_picker::max_pieces)
		{
			set_error(errors::too_many_pieces_in_torrent, torrent_status::error_file_none);
			pause();
			return;
		}

		if (m_torrent_file->num_pieces() == 0)
		{
			set_error(errors::torrent_invalid_length, torrent_status::error_file_none);
			pause();
			return;
		}

		int const blocks_per_piece
			= (m_torrent_file->piece_length() + default_block_size - 1) / default_block_size;
		if (blocks_per_piece > piece_picker::max_blocks_per_piece)
		{
			set_error(errors::invalid_piece_size, torrent_status::error_file_none);
			pause();
			return;
		}

		// --- MAPPED FILES ---
		file_storage const& fs = m_torrent_file->files();
		if (m_add_torrent_params)
		{
			for (auto const& f : m_add_torrent_params->renamed_files)
			{
				if (f.first < file_index_t(0) || f.first >= fs.end_file()) continue;
				m_torrent_file->rename_file(file_index_t(f.first), f.second);
			}
		}

		construct_storage();

#ifndef TORRENT_DISABLE_SHARE_MODE
		if (m_share_mode && valid_metadata())
		{
			// in share mode, all pieces have their priorities initialized to 0
			m_file_priority.clear();
			m_file_priority.resize(m_torrent_file->num_files(), dont_download);
		}
#endif

		// it's important to initialize the peers early, because this is what will
		// fix up their have-bitmasks to have the correct size
		// TODO: 2 add a unit test where we don't have metadata, connect to a peer
		// that sends a bitfield that's too large, then we get the metadata
		if (!m_connections_initialized)
		{
			m_connections_initialized = true;
			// all peer connections have to initialize themselves now that the metadata
			// is available
			// copy the peer list since peers may disconnect and invalidate
			// m_connections as we initialize them
			for (auto* const c : m_connections)
			{
				auto pc = c->self();
				if (pc->is_disconnecting()) continue;
				pc->on_metadata_impl();
				if (pc->is_disconnecting()) continue;
				pc->init();
			}
		}

		// in case file priorities were passed in via the add_torrent_params
		// and also in the case of share mode, we need to update the priorities
		// this has to be applied before piece priority
		if (!m_file_priority.empty())
		{
			// m_file_priority was loaded from the resume data, this doesn't
			// alter any state that needs to be saved in the resume data
			auto const ns = m_need_save_resume_data;
			update_piece_priorities(m_file_priority);
			m_need_save_resume_data = ns;
		}

		if (m_add_torrent_params)
		{
			piece_index_t idx(0);
			if (m_add_torrent_params->piece_priorities.size() > std::size_t(m_torrent_file->num_pieces()))
				m_add_torrent_params->piece_priorities.resize(std::size_t(m_torrent_file->num_pieces()));

			for (auto prio : m_add_torrent_params->piece_priorities)
			{
				if (has_picker() || prio != default_priority)
				{
					need_picker();
					m_picker->set_piece_priority(idx, prio);
				}
				++idx;
			}
			update_gauge();
		}

		if (m_seed_mode)
		{
			m_have_all = true;
			update_gauge();
			update_state_list();
			update_want_tick();
		}
		else
		{
			need_picker();

			TORRENT_ASSERT(block_size() > 0);

			m_padding_bytes = 0;
			std::vector<piece_index_t> have_pieces;

			aux::apply_pad_files(fs, [&](piece_index_t const piece, int const bytes)
			{
				m_padding_bytes += bytes;
				if (bytes == fs.piece_size(piece))
					have_pieces.push_back(piece);
				m_picker->set_pad_bytes(piece, bytes);
			});

			for (auto i : have_pieces)
			{
				// we may have this piece already, if we picked it up from
				// resume data.
				if (m_picker->have_piece(i)) continue;
//				picker().piece_passed(i);
//				TORRENT_ASSERT(picker().have_piece(i));
				we_have(i);
			}
		}

		set_state(torrent_status::checking_resume_data);

		aux::vector<std::string, file_index_t> links;
#ifndef TORRENT_DISABLE_MUTABLE_TORRENTS
		if (!m_torrent_file->similar_torrents().empty()
			|| !m_torrent_file->collections().empty())
		{
			resolve_links res(m_torrent_file);

			for (auto const& ih : m_torrent_file->similar_torrents())
			{
				std::shared_ptr<torrent> t = m_ses.find_torrent(info_hash_t(ih)).lock();
				if (!t) continue;

				// Only attempt to reuse files from torrents that are seeding.
				// TODO: this could be optimized by looking up which files are
				// complete and just look at those
				if (!t->is_seed()) continue;

				res.match(t->get_torrent_file(), t->save_path());
			}
			for (auto const& c : m_torrent_file->collections())
			{
				std::vector<std::shared_ptr<torrent>> ts = m_ses.find_collection(c);

				for (auto const& t : ts)
				{
					// Only attempt to reuse files from torrents that are seeding.
					// TODO: this could be optimized by looking up which files are
					// complete and just look at those
					if (!t->is_seed()) continue;

					res.match(t->get_torrent_file(), t->save_path());
				}
			}

			std::vector<resolve_links::link_t> const& l = res.get_links();
			if (!l.empty())
			{
				links.resize(m_torrent_file->files().num_files());
				for (auto const& i : l)
				{
					if (!i.ti) continue;
					links[i.file_idx] = combine_path(i.save_path
						, i.ti->files().file_path(i.file_idx));
				}
			}
		}
#endif // TORRENT_DISABLE_MUTABLE_TORRENTS

#if TORRENT_USE_ASSERTS
		TORRENT_ASSERT(m_outstanding_check_files == false);
		m_outstanding_check_files = true;
#endif

		if (!m_add_torrent_params || !(m_add_torrent_params->flags & torrent_flags::no_verify_files))
		{
			m_ses.disk_thread().async_check_files(
				m_storage, m_add_torrent_params ? m_add_torrent_params.get() : nullptr
				, std::move(links), [self = shared_from_this()](status_t st, storage_error const& error)
				{ self->on_resume_data_checked(st, error); });
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("init, async_check_files");
#endif
			m_ses.deferred_submit_jobs();
		}
		else
		{
			on_resume_data_checked({}, storage_error{});
		}

		update_want_peers();
		update_want_tick();

		// this will remove the piece picker, if we're done with it
		maybe_done_flushing();

		m_torrent_initialized = true;
	}